

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O2

void __thiscall cmGhsMultiTargetGenerator::Generate(cmGhsMultiTargetGenerator *this)

{
  bool bVar1;
  TargetType TVar2;
  int iVar3;
  undefined4 extraout_var;
  string msg;
  string local_120;
  cmAlphaNum local_100;
  undefined1 local_d0 [192];
  
  TVar2 = cmGeneratorTarget::GetType(this->GeneratorTarget);
  switch(TVar2) {
  case EXECUTABLE:
    cmGeneratorTarget::GetExecutableNames((Names *)local_d0,this->GeneratorTarget,&this->ConfigName)
    ;
    std::__cxx11::string::operator=((string *)&this->TargetNameReal,(string *)(local_d0 + 0x40));
    cmGeneratorTarget::Names::~Names((Names *)local_d0);
    bVar1 = DetermineIfIntegrityApp(this);
    if (bVar1) {
      this->TagType = INTERGRITY_APPLICATION;
    }
    else {
      this->TagType = PROGRAM;
    }
    break;
  case STATIC_LIBRARY:
    cmGeneratorTarget::GetLibraryNames((Names *)local_d0,this->GeneratorTarget,&this->ConfigName);
    std::__cxx11::string::operator=((string *)&this->TargetNameReal,(string *)(local_d0 + 0x40));
    cmGeneratorTarget::Names::~Names((Names *)local_d0);
    this->TagType = LIBRARY;
    break;
  case SHARED_LIBRARY:
    local_d0._0_8_ = (pointer)0x2e;
    local_d0._8_8_ = "add_library(<name> SHARED ...) not supported: ";
    local_100.View_._M_str = (this->Name)._M_dataplus._M_p;
    local_100.View_._M_len = (this->Name)._M_string_length;
    cmStrCat<>(&local_120,(cmAlphaNum *)local_d0,&local_100);
    cmSystemTools::Message(&local_120,(char *)0x0);
    goto LAB_00249fae;
  case MODULE_LIBRARY:
    local_d0._0_8_ = (pointer)0x2e;
    local_d0._8_8_ = "add_library(<name> MODULE ...) not supported: ";
    local_100.View_._M_str = (this->Name)._M_dataplus._M_p;
    local_100.View_._M_len = (this->Name)._M_string_length;
    cmStrCat<>(&local_120,(cmAlphaNum *)local_d0,&local_100);
    cmSystemTools::Message(&local_120,(char *)0x0);
LAB_00249fae:
    std::__cxx11::string::~string((string *)&local_120);
    return;
  case OBJECT_LIBRARY:
    cmGeneratorTarget::GetLibraryNames((Names *)local_d0,this->GeneratorTarget,&this->ConfigName);
    std::__cxx11::string::operator=((string *)&this->TargetNameReal,(string *)(local_d0 + 0x40));
    cmGeneratorTarget::Names::~Names((Names *)local_d0);
    this->TagType = SUBPROJECT;
    break;
  case UTILITY:
    cmGeneratorTarget::GetName_abi_cxx11_(this->GeneratorTarget);
    std::__cxx11::string::_M_assign((string *)&this->TargetNameReal);
    goto LAB_0024a055;
  case GLOBAL_TARGET:
    cmGeneratorTarget::GetName_abi_cxx11_(this->GeneratorTarget);
    std::__cxx11::string::_M_assign((string *)&this->TargetNameReal);
    iVar3 = (*((this->LocalGenerator->super_cmLocalGenerator).GlobalGenerator)->
              _vptr_cmGlobalGenerator[0x1a])();
    bVar1 = std::operator==(&this->TargetNameReal,(char *)CONCAT44(extraout_var,iVar3));
    if (!bVar1) {
      return;
    }
LAB_0024a055:
    this->TagType = CUSTOM_TARGET;
    break;
  default:
    goto switchD_00249e87_default;
  }
  GenerateTarget(this);
switchD_00249e87_default:
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::Generate()
{
  // Determine type of target for this project
  switch (this->GeneratorTarget->GetType()) {
    case cmStateEnums::EXECUTABLE: {
      // Get the name of the executable to generate.
      this->TargetNameReal =
        this->GeneratorTarget->GetExecutableNames(this->ConfigName).Real;
      if (this->cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()) {
        this->TagType = GhsMultiGpj::INTERGRITY_APPLICATION;
      } else {
        this->TagType = GhsMultiGpj::PROGRAM;
      }
      break;
    }
    case cmStateEnums::STATIC_LIBRARY: {
      this->TargetNameReal =
        this->GeneratorTarget->GetLibraryNames(this->ConfigName).Real;
      this->TagType = GhsMultiGpj::LIBRARY;
      break;
    }
    case cmStateEnums::SHARED_LIBRARY: {
      std::string msg =
        cmStrCat("add_library(<name> SHARED ...) not supported: ", this->Name);
      cmSystemTools::Message(msg);
      return;
    }
    case cmStateEnums::OBJECT_LIBRARY: {
      this->TargetNameReal =
        this->GeneratorTarget->GetLibraryNames(this->ConfigName).Real;
      this->TagType = GhsMultiGpj::SUBPROJECT;
      break;
    }
    case cmStateEnums::MODULE_LIBRARY: {
      std::string msg =
        cmStrCat("add_library(<name> MODULE ...) not supported: ", this->Name);
      cmSystemTools::Message(msg);
      return;
    }
    case cmStateEnums::UTILITY: {
      this->TargetNameReal = this->GeneratorTarget->GetName();
      this->TagType = GhsMultiGpj::CUSTOM_TARGET;
      break;
    }
    case cmStateEnums::GLOBAL_TARGET: {
      this->TargetNameReal = this->GeneratorTarget->GetName();
      if (this->TargetNameReal ==
          this->GetGlobalGenerator()->GetInstallTargetName()) {
        this->TagType = GhsMultiGpj::CUSTOM_TARGET;
      } else {
        return;
      }
      break;
    }
    default:
      return;
  }

  this->GenerateTarget();
}